

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SR_binary.hh
# Opt level: O0

size_t OpenMesh::IO::
       binary<OpenMesh::DefaultTraits::EdgeT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
       ::restore(istream *param_1,value_type *param_2,bool param_3)

{
  ostream *poVar1;
  char *pcVar2;
  logic_error *this;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream msg;
  bool param_2_local;
  value_type *param_1_local;
  istream *param_0_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"Type not supported: ");
  pcVar2 = std::type_info::name
                     ((type_info *)
                      &DefaultTraits::
                       EdgeT<OpenMesh::FinalMeshItemsT<MyTraits,true>::ITraits,OpenMesh::FinalMeshItemsT<MyTraits,true>::Refs>
                       ::typeinfo);
  std::operator<<(poVar1,pcVar2);
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::logic_error::logic_error(this,local_1c8);
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static 
  size_t restore( std::istream& /* _is */,
		  value_type& /* _v */,
		  bool /* _swap=false */)
  { X; return 0; }